

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void writeAltFmtXV(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                  int spike)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  dotNode *pdVar4;
  long lVar5;
  
  pcVar1 = "# begin %s\n";
  if (showEnd == 0) {
    pcVar1 = "# begin object\n#  group: %s\n";
  }
  pcVar3 = "#  group: %s\n";
  if (showBegin != 0) {
    pcVar3 = pcVar1;
  }
  fprintf((FILE *)outf,pcVar3,groupname);
  lVar2 = 0;
  do {
    lVar5 = 0;
    do {
      pdVar4 = results[lVar5][lVar2];
      if (pdVar4 != (dotNode *)0x0) {
        pcVar1 = getAtomName((int)lVar5);
        fprintf((FILE *)outf,"#  (%s %s)\n",pcVar1,(&PTR_anon_var_dwarf_11858_0014bd90)[lVar2]);
        pcVar1 = getColor((int)lVar5);
        do {
          if ((ColorGap == '\0') && (pcVar1 = "124", pdVar4->t != (atom *)0x0)) {
            pcVar1 = assignGapColorForKin(pdVar4->gap,(int)lVar2);
          }
          fprintf((FILE *)outf,"%.3f %.3f %.3f %.3f %.3f %.3f %s\n",pcVar1);
          pdVar4 = pdVar4->next;
        } while (pdVar4 != (dotNode_t *)0x0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x72);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  pcVar1 = "# end %s\n";
  if (showBegin == 0) {
    pcVar1 = "#  endgroup: %s\n# end object\n";
  }
  pcVar3 = "#  endgroup: %s\n";
  if (showEnd != 0) {
    pcVar3 = pcVar1;
  }
  fprintf((FILE *)outf,pcVar3,groupname);
  return;
}

Assistant:

void writeAltFmtXV(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j;
   dotNode *node;
   char *color = "";
   //Old: char *mast[NODEWIDTH] = {"wide contact", "close contact", "small overlap", "bad overlap", "H-bonds"};
    /* 04/15/2015 SJ changed to reflect new NODEWIDTH, see probe.h*/
   char *mast[NODEWIDTH] = {"wide contact", "close contact", "weak H-bonds", "small overlap", "bad overlap", "worse overlap", "H-bonds"};
    
   if (showBegin) {
      if (showEnd) { fprintf(outf, "# begin %s\n", groupname); }
      else         { fprintf(outf, "# begin object\n#  group: %s\n", groupname); }
   }
   else            { fprintf(outf, "#  group: %s\n", groupname); }

   for (j = 0; j < NODEWIDTH; j++) {
      for (i = 0; i < NUMATOMTYPES; i++) {
	 node = results[i][j];
	 if (node) {
	    fprintf(outf, "#  (%s %s)\n", getAtomName(i), mast[j]);
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForXV(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if ((j == 3 || j == 4 || j == 5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "%.3f %.3f %.3f %.3f %.3f %.3f %s\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z, color);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "%.3f %.3f %.3f %.3f %.3f %.3f %s\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->loc.x, node->loc.y, node->loc.z, color);
	    }
	    node = node->next;
	 }
      }
   }
   if (showEnd) {
      if (showBegin) { fprintf(outf, "# end %s\n", groupname); }
      else           { fprintf(outf, "#  endgroup: %s\n# end object\n", groupname); }
   }
   else              { fprintf(outf, "#  endgroup: %s\n", groupname); }
}